

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void wabt::WriteOpcode(Stream *stream,Opcode opcode)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  char *pcVar4;
  Stream *stream_local;
  Opcode opcode_local;
  
  stream_local._4_4_ = opcode.enum_;
  bVar1 = Opcode::HasPrefix((Opcode *)((long)&stream_local + 4));
  if (bVar1) {
    bVar2 = Opcode::GetPrefix((Opcode *)((long)&stream_local + 4));
    Stream::WriteU8(stream,(uint)bVar2,"prefix",No);
    uVar3 = Opcode::GetCode((Opcode *)((long)&stream_local + 4));
    pcVar4 = Opcode::GetName((Opcode *)((long)&stream_local + 4));
    WriteU32Leb128(stream,uVar3,pcVar4);
  }
  else {
    uVar3 = Opcode::GetCode((Opcode *)((long)&stream_local + 4));
    pcVar4 = Opcode::GetName((Opcode *)((long)&stream_local + 4));
    Stream::WriteU8(stream,uVar3,pcVar4,No);
  }
  return;
}

Assistant:

void WriteOpcode(Stream* stream, Opcode opcode) {
  if (opcode.HasPrefix()) {
    stream->WriteU8(opcode.GetPrefix(), "prefix");
    WriteU32Leb128(stream, opcode.GetCode(), opcode.GetName());
  } else {
    stream->WriteU8(opcode.GetCode(), opcode.GetName());
  }
}